

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::updateActivityUbChange(HighsDomain *this,HighsInt col,double oldbound,double newbound)

{
  HighsCDouble activity;
  HighsCDouble activity_00;
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  reference pvVar5;
  pointer pHVar6;
  size_type sVar7;
  reference pvVar8;
  reference pvVar9;
  int in_ESI;
  HighsDomain *in_RDI;
  ConflictPoolPropagation *conflictprop;
  iterator __end2_1;
  iterator __begin2_1;
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  *__range2_1;
  HighsInt i_1;
  CutpoolPropagation *cutpoolprop;
  iterator __end2;
  iterator __begin2;
  deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_> *__range2
  ;
  HighsCDouble deltamin;
  HighsCDouble deltamax;
  HighsInt i;
  HighsInt end;
  HighsInt start;
  HighsLp *mip;
  _Self *in_stack_fffffffffffffcb8;
  _Self *in_stack_fffffffffffffcc0;
  HighsCDouble *in_stack_fffffffffffffcc8;
  double in_stack_fffffffffffffcd0;
  double in_stack_fffffffffffffcd8;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *this_00;
  double in_stack_fffffffffffffce0;
  vector<int,_std::allocator<int>_> *this_01;
  double in_stack_fffffffffffffce8;
  ConflictPoolPropagation *in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  HighsDomain *in_stack_fffffffffffffd00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd08;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffd10;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd18;
  HighsDomain *in_stack_fffffffffffffd20;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffd28;
  HighsDomain *in_stack_fffffffffffffd30;
  bool local_2b1;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdd8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffde0;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *in_stack_fffffffffffffde8;
  HighsInt col_00;
  ObjectivePropagation *in_stack_fffffffffffffdf0;
  bool local_1f1;
  _Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
  local_148;
  deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
  *local_128;
  HighsCDouble local_120;
  HighsCDouble local_110;
  value_type local_fc;
  reference local_f8;
  _Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
  local_d0;
  deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_> *local_b0
  ;
  Reason local_a8;
  HighsCDouble local_a0;
  double local_90;
  double local_88;
  HighsCDouble local_80;
  Reason local_70;
  HighsCDouble local_68;
  double local_58;
  double local_50;
  HighsCDouble local_48;
  value_type local_34;
  value_type local_30;
  value_type local_2c;
  HighsLp *local_28;
  double local_20;
  double local_18;
  int local_c;
  
  local_28 = in_RDI->mipsolver->model_;
  local_c = in_ESI;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(local_28->a_matrix_).start_,(long)in_ESI);
  local_2c = *pvVar2;
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&(local_28->a_matrix_).start_,(long)(local_c + 1));
  local_30 = *pvVar2;
  bVar1 = ObjectivePropagation::isActive(&in_RDI->objProp_);
  if ((!bVar1) ||
     (ObjectivePropagation::updateActivityUbChange
                (in_stack_fffffffffffffdf0,(HighsInt)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                 (double)in_stack_fffffffffffffde0,(double)in_stack_fffffffffffffdd8),
     (in_RDI->infeasible_ & 1U) == 0)) {
    for (local_34 = local_2c; local_34 != local_30; local_34 = local_34 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&(local_28->a_matrix_).value_,(long)local_34);
      if (*pvVar3 <= 0.0) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&(local_28->a_matrix_).value_,(long)local_34);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(local_28->a_matrix_).index_,(long)local_34);
        std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->activitymininf_,(long)*pvVar2);
        local_80 = computeDelta((double)in_stack_fffffffffffffd20,(double)in_stack_fffffffffffffd18,
                                (double)in_stack_fffffffffffffd10,(double)in_stack_fffffffffffffd08,
                                (HighsInt *)in_stack_fffffffffffffd00);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(local_28->a_matrix_).index_,(long)local_34);
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (&in_RDI->activitymin_,(long)*pvVar2);
        HighsCDouble::operator+=
                  ((HighsCDouble *)in_stack_fffffffffffffcc0,
                   (HighsCDouble *)in_stack_fffffffffffffcb8);
        if ((in_RDI->recordRedundantRows_ & 1U) != 0) {
          pvVar4 = &local_28->row_lower_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_34);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
          if ((*pvVar3 != -INFINITY) || (NAN(*pvVar3))) {
            pvVar4 = &local_28->row_upper_;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(local_28->a_matrix_).index_,(long)local_34);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
            if ((*pvVar3 == INFINITY) && (!NAN(*pvVar3))) {
              std::vector<int,_std::allocator<int>_>::operator[]
                        (&(local_28->a_matrix_).index_,(long)local_34);
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              std::vector<int,_std::allocator<int>_>::operator[]
                        (&in_RDI->activitymininf_,(long)*pvVar2);
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              pvVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                                 (&in_RDI->activitymin_,(long)*pvVar2);
              local_90 = pvVar5->hi;
              local_88 = pvVar5->lo;
              pvVar4 = &local_28->row_lower_;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
              activity_00.lo = (double)in_stack_fffffffffffffd10;
              activity_00.hi = (double)in_stack_fffffffffffffd08;
              updateRedundantRows(in_stack_fffffffffffffd00,
                                  (HighsInt)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                  (HighsInt)in_stack_fffffffffffffcf8,
                                  (HighsInt)((ulong)in_stack_fffffffffffffcf0 >> 0x20),activity_00,
                                  in_stack_fffffffffffffce8);
            }
          }
        }
        bVar1 = HighsCDouble::operator<=
                          ((HighsCDouble *)in_stack_fffffffffffffcc0,
                           (double)in_stack_fffffffffffffcb8);
        if (bVar1) {
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&(local_28->a_matrix_).value_,(long)local_34);
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_34);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&in_RDI->capacityThreshold_,(long)*pvVar2);
          updateThresholdUbChange
                    (in_stack_fffffffffffffd30,(HighsInt)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                     (double)in_stack_fffffffffffffd20,(double)in_stack_fffffffffffffd18,
                     (double *)in_stack_fffffffffffffd10);
        }
        else {
          pvVar4 = &local_28->row_upper_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_34);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
          local_2b1 = false;
          if ((*pvVar3 != INFINITY) || (NAN(*pvVar3))) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(local_28->a_matrix_).index_,(long)local_34);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->activitymininf_,(long)*pvVar2);
            local_2b1 = false;
            if (*pvVar8 == 0) {
              in_stack_fffffffffffffd20 = (HighsDomain *)&in_RDI->activitymin_;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              in_stack_fffffffffffffd30 =
                   (HighsDomain *)
                   std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                             ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                              in_stack_fffffffffffffd20,(long)*pvVar2);
              in_stack_fffffffffffffd28 = &local_28->row_upper_;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              std::vector<double,_std::allocator<double>_>::operator[]
                        (in_stack_fffffffffffffd28,(long)*pvVar2);
              local_a0 = HighsCDouble::operator-
                                   ((HighsCDouble *)in_stack_fffffffffffffcc0,
                                    (double)in_stack_fffffffffffffcb8);
              std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x5c5ca0);
              local_2b1 = HighsCDouble::operator>
                                    ((HighsCDouble *)in_stack_fffffffffffffcc0,
                                     (double)in_stack_fffffffffffffcb8);
            }
          }
          if (local_2b1 != false) {
            pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x5c5ce7);
            HighsDebugSol::nodePruned((HighsDebugSol *)&pHVar6->field_0x68b0,in_RDI);
            in_RDI->infeasible_ = true;
            sVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                              (&in_RDI->domchgstack_);
            in_RDI->infeasible_pos = (HighsInt)sVar7;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(local_28->a_matrix_).index_,(long)local_34);
            local_a8 = Reason::modelRowUpper(*pvVar2);
            in_RDI->infeasible_reason = local_a8;
            local_30 = local_34 + 1;
            break;
          }
          in_stack_fffffffffffffd18 = &in_RDI->activitymininf_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_34);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_fffffffffffffd18,(long)*pvVar2);
          if (*pvVar8 < 2) {
            in_stack_fffffffffffffd10 = &in_RDI->propagateflags_;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(local_28->a_matrix_).index_,(long)local_34);
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (in_stack_fffffffffffffd10,(long)*pvVar2);
            if (*pvVar9 == '\0') {
              in_stack_fffffffffffffd08 = &local_28->row_upper_;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (in_stack_fffffffffffffd08,(long)*pvVar2);
              if ((*pvVar3 != INFINITY) || (NAN(*pvVar3))) {
                std::vector<int,_std::allocator<int>_>::operator[]
                          (&(local_28->a_matrix_).index_,(long)local_34);
                markPropagate(in_stack_fffffffffffffd20,
                              (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
              }
            }
          }
        }
      }
      else {
        std::vector<double,_std::allocator<double>_>::operator[]
                  (&(local_28->a_matrix_).value_,(long)local_34);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(local_28->a_matrix_).index_,(long)local_34);
        std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->activitymaxinf_,(long)*pvVar2);
        local_48 = computeDelta((double)in_stack_fffffffffffffd20,(double)in_stack_fffffffffffffd18,
                                (double)in_stack_fffffffffffffd10,(double)in_stack_fffffffffffffd08,
                                (HighsInt *)in_stack_fffffffffffffd00);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&(local_28->a_matrix_).index_,(long)local_34);
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (&in_RDI->activitymax_,(long)*pvVar2);
        HighsCDouble::operator+=
                  ((HighsCDouble *)in_stack_fffffffffffffcc0,
                   (HighsCDouble *)in_stack_fffffffffffffcb8);
        if ((in_RDI->recordRedundantRows_ & 1U) != 0) {
          pvVar4 = &local_28->row_lower_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_34);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
          if ((*pvVar3 == -INFINITY) && (!NAN(*pvVar3))) {
            pvVar4 = &local_28->row_upper_;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(local_28->a_matrix_).index_,(long)local_34);
            pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
            if ((*pvVar3 != INFINITY) || (NAN(*pvVar3))) {
              std::vector<int,_std::allocator<int>_>::operator[]
                        (&(local_28->a_matrix_).index_,(long)local_34);
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              std::vector<int,_std::allocator<int>_>::operator[]
                        (&in_RDI->activitymaxinf_,(long)*pvVar2);
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              pvVar5 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                                 (&in_RDI->activitymax_,(long)*pvVar2);
              local_58 = pvVar5->hi;
              local_50 = pvVar5->lo;
              pvVar4 = &local_28->row_upper_;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
              activity.lo = (double)in_stack_fffffffffffffd10;
              activity.hi = (double)in_stack_fffffffffffffd08;
              updateRedundantRows(in_stack_fffffffffffffd00,
                                  (HighsInt)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                                  (HighsInt)in_stack_fffffffffffffcf8,
                                  (HighsInt)((ulong)in_stack_fffffffffffffcf0 >> 0x20),activity,
                                  in_stack_fffffffffffffce8);
            }
          }
        }
        bVar1 = HighsCDouble::operator>=
                          ((HighsCDouble *)in_stack_fffffffffffffcc0,
                           (double)in_stack_fffffffffffffcb8);
        if (bVar1) {
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&(local_28->a_matrix_).value_,(long)local_34);
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_34);
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&in_RDI->capacityThreshold_,(long)*pvVar2);
          updateThresholdUbChange
                    (in_stack_fffffffffffffd30,(HighsInt)((ulong)in_stack_fffffffffffffd28 >> 0x20),
                     (double)in_stack_fffffffffffffd20,(double)in_stack_fffffffffffffd18,
                     (double *)in_stack_fffffffffffffd10);
        }
        else {
          pvVar4 = &local_28->row_lower_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_34);
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](pvVar4,(long)*pvVar2);
          local_1f1 = false;
          if ((*pvVar3 != -INFINITY) || (NAN(*pvVar3))) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(local_28->a_matrix_).index_,(long)local_34);
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->activitymaxinf_,(long)*pvVar2);
            local_1f1 = false;
            if (*pvVar8 == 0) {
              in_stack_fffffffffffffde0 = &local_28->row_lower_;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (in_stack_fffffffffffffde0,(long)*pvVar2);
              in_stack_fffffffffffffdf0 = (ObjectivePropagation *)*pvVar3;
              in_stack_fffffffffffffde8 = &in_RDI->activitymax_;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                        (in_stack_fffffffffffffde8,(long)*pvVar2);
              local_68 = ::operator-(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
              operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *
                         )0x5c54de);
              local_1f1 = HighsCDouble::operator>
                                    ((HighsCDouble *)in_stack_fffffffffffffcc0,
                                     (double)in_stack_fffffffffffffcb8);
            }
          }
          if (local_1f1 != false) {
            pHVar6 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::
                     operator->((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                                 *)0x5c5525);
            HighsDebugSol::nodePruned((HighsDebugSol *)&pHVar6->field_0x68b0,in_RDI);
            in_RDI->infeasible_ = true;
            sVar7 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size
                              (&in_RDI->domchgstack_);
            in_RDI->infeasible_pos = (HighsInt)sVar7;
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(local_28->a_matrix_).index_,(long)local_34);
            local_70 = Reason::modelRowLower(*pvVar2);
            in_RDI->infeasible_reason = local_70;
            local_30 = local_34 + 1;
            break;
          }
          in_stack_fffffffffffffdd8 = &in_RDI->activitymaxinf_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_34);
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                             (in_stack_fffffffffffffdd8,(long)*pvVar2);
          if (*pvVar8 < 2) {
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&(local_28->a_matrix_).index_,(long)local_34);
            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                               (&in_RDI->propagateflags_,(long)*pvVar2);
            if (*pvVar9 == '\0') {
              pvVar4 = &local_28->row_lower_;
              pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (&(local_28->a_matrix_).index_,(long)local_34);
              pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                                 (pvVar4,(long)*pvVar2);
              if ((*pvVar3 != -INFINITY) || (NAN(*pvVar3))) {
                std::vector<int,_std::allocator<int>_>::operator[]
                          (&(local_28->a_matrix_).index_,(long)local_34);
                markPropagate(in_stack_fffffffffffffd20,
                              (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20));
              }
            }
          }
        }
      }
    }
    if ((in_RDI->infeasible_ & 1U) == 0) {
      local_b0 = &in_RDI->cutpoolpropagation;
      std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
      ::begin((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
               *)in_stack_fffffffffffffcb8);
      std::deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
      ::end((deque<HighsDomain::CutpoolPropagation,_std::allocator<HighsDomain::CutpoolPropagation>_>
             *)in_stack_fffffffffffffcb8);
      while (bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffcc0,
                                     (_Self *)in_stack_fffffffffffffcb8), bVar1) {
        local_f8 = std::
                   _Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
                   ::operator*(&local_d0);
        CutpoolPropagation::updateActivityUbChange
                  ((CutpoolPropagation *)in_stack_fffffffffffffd20,
                   (HighsInt)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                   (double)in_stack_fffffffffffffd10,(double)in_stack_fffffffffffffd08);
        std::
        _Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
        ::operator++((_Deque_iterator<HighsDomain::CutpoolPropagation,_HighsDomain::CutpoolPropagation_&,_HighsDomain::CutpoolPropagation_*>
                      *)in_stack_fffffffffffffcc0);
      }
    }
    if ((in_RDI->infeasible_ & 1U) == 0) {
      local_128 = &in_RDI->conflictPoolPropagation;
      std::
      deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
      ::begin((deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
               *)in_stack_fffffffffffffcb8);
      std::
      deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
      ::end((deque<HighsDomain::ConflictPoolPropagation,_std::allocator<HighsDomain::ConflictPoolPropagation>_>
             *)in_stack_fffffffffffffcb8);
      while (bVar1 = std::operator!=(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8), bVar1) {
        std::
        _Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
        ::operator*(&local_148);
        ConflictPoolPropagation::updateActivityUbChange
                  (in_stack_fffffffffffffcf0,(HighsInt)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                   in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        std::
        _Deque_iterator<HighsDomain::ConflictPoolPropagation,_HighsDomain::ConflictPoolPropagation_&,_HighsDomain::ConflictPoolPropagation_*>
        ::operator++(in_stack_fffffffffffffcc0);
      }
    }
    else {
      std::swap<double>(&local_18,&local_20);
      for (local_fc = local_2c; col_00 = (HighsInt)((ulong)in_stack_fffffffffffffde8 >> 0x20),
          local_fc != local_30; local_fc = local_fc + 1) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&(local_28->a_matrix_).value_,(long)local_fc);
        if (*pvVar3 <= 0.0) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&(local_28->a_matrix_).value_,(long)local_fc);
          in_stack_fffffffffffffcc0 = (_Self *)*pvVar3;
          in_stack_fffffffffffffcb8 = (_Self *)&in_RDI->activitymininf_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_fc);
          std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcb8,(long)*pvVar2);
          local_120 = computeDelta((double)in_stack_fffffffffffffd20,
                                   (double)in_stack_fffffffffffffd18,
                                   (double)in_stack_fffffffffffffd10,
                                   (double)in_stack_fffffffffffffd08,
                                   (HighsInt *)in_stack_fffffffffffffd00);
          this_00 = &in_RDI->activitymin_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_fc);
          std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                    (this_00,(long)*pvVar2);
          HighsCDouble::operator+=
                    ((HighsCDouble *)in_stack_fffffffffffffcc0,
                     (HighsCDouble *)in_stack_fffffffffffffcb8);
        }
        else {
          std::vector<double,_std::allocator<double>_>::operator[]
                    (&(local_28->a_matrix_).value_,(long)local_fc);
          this_01 = &in_RDI->activitymaxinf_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_fc);
          std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)*pvVar2);
          local_110 = computeDelta((double)in_stack_fffffffffffffd20,
                                   (double)in_stack_fffffffffffffd18,
                                   (double)in_stack_fffffffffffffd10,
                                   (double)in_stack_fffffffffffffd08,
                                   (HighsInt *)in_stack_fffffffffffffd00);
          in_stack_fffffffffffffd00 = (HighsDomain *)&in_RDI->activitymax_;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(local_28->a_matrix_).index_,(long)local_fc);
          std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                    ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)
                     in_stack_fffffffffffffd00,(long)*pvVar2);
          HighsCDouble::operator+=
                    ((HighsCDouble *)in_stack_fffffffffffffcc0,
                     (HighsCDouble *)in_stack_fffffffffffffcb8);
        }
      }
      bVar1 = ObjectivePropagation::isActive(&in_RDI->objProp_);
      if (bVar1) {
        ObjectivePropagation::updateActivityUbChange
                  (in_stack_fffffffffffffdf0,col_00,(double)in_stack_fffffffffffffde0,
                   (double)in_stack_fffffffffffffdd8);
      }
    }
  }
  return;
}

Assistant:

void HighsDomain::updateActivityUbChange(HighsInt col, double oldbound,
                                         double newbound) {
  auto mip = mipsolver->model_;
  HighsInt start = mip->a_matrix_.start_[col];
  HighsInt end = mip->a_matrix_.start_[col + 1];

  assert(!infeasible_);

  if (objProp_.isActive()) {
    objProp_.updateActivityUbChange(col, oldbound, newbound);
    if (infeasible_) return;
  }

  for (HighsInt i = start; i != end; ++i) {
    if (mip->a_matrix_.value_[i] > 0) {
      HighsCDouble deltamax =
          computeDelta(mip->a_matrix_.value_[i], oldbound, newbound, kHighsInf,
                       activitymaxinf_[mip->a_matrix_.index_[i]]);
      activitymax_[mip->a_matrix_.index_[i]] += deltamax;

#ifndef NDEBUG
      {
        HighsInt tmpinf;
        HighsCDouble tmpmaxact;
        computeMaxActivity(
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i]],
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i] + 1],
            mipsolver->mipdata_->ARindex_.data(),
            mipsolver->mipdata_->ARvalue_.data(), tmpinf, tmpmaxact);
        assert(std::fabs(double(activitymax_[mip->a_matrix_.index_[i]] -
                                tmpmaxact)) <= mipsolver->mipdata_->feastol);
        assert(tmpinf == activitymaxinf_[mip->a_matrix_.index_[i]]);
      }
#endif

      if (recordRedundantRows_ &&
          mip->row_lower_[mip->a_matrix_.index_[i]] == -kHighsInf &&
          mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf)
        updateRedundantRows(mip->a_matrix_.index_[i], HighsInt{-1},
                            activitymaxinf_[mip->a_matrix_.index_[i]],
                            activitymax_[mip->a_matrix_.index_[i]],
                            mip->row_upper_[mip->a_matrix_.index_[i]]);

      if (deltamax >= 0) {
        updateThresholdUbChange(col, newbound, mip->a_matrix_.value_[i],
                                capacityThreshold_[mip->a_matrix_.index_[i]]);
        continue;
      }

      if (mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf &&
          activitymaxinf_[mip->a_matrix_.index_[i]] == 0 &&
          mip->row_lower_[mip->a_matrix_.index_[i]] -
                  activitymax_[mip->a_matrix_.index_[i]] >
              mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        infeasible_ = true;
        infeasible_pos = domchgstack_.size();
        infeasible_reason = Reason::modelRowLower(mip->a_matrix_.index_[i]);
        end = i + 1;
        break;
      }

      if (activitymaxinf_[mip->a_matrix_.index_[i]] <= 1 &&
          !propagateflags_[mip->a_matrix_.index_[i]] &&
          mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf) {
        markPropagate(mip->a_matrix_.index_[i]);
        // propagateflags_[mip->a_matrix_.index_[i]] = 1;
        // propagateinds_.push_back(mip->a_matrix_.index_[i]);
      }
    } else {
      HighsCDouble deltamin =
          computeDelta(mip->a_matrix_.value_[i], oldbound, newbound, kHighsInf,
                       activitymininf_[mip->a_matrix_.index_[i]]);
      activitymin_[mip->a_matrix_.index_[i]] += deltamin;

#ifndef NDEBUG
      {
        HighsInt tmpinf;
        HighsCDouble tmpminact;
        computeMinActivity(
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i]],
            mipsolver->mipdata_->ARstart_[mip->a_matrix_.index_[i] + 1],
            mipsolver->mipdata_->ARindex_.data(),
            mipsolver->mipdata_->ARvalue_.data(), tmpinf, tmpminact);
        assert(std::fabs(double(activitymin_[mip->a_matrix_.index_[i]] -
                                tmpminact)) <= mipsolver->mipdata_->feastol);
        assert(tmpinf == activitymininf_[mip->a_matrix_.index_[i]]);
      }
#endif

      if (recordRedundantRows_ &&
          mip->row_lower_[mip->a_matrix_.index_[i]] != -kHighsInf &&
          mip->row_upper_[mip->a_matrix_.index_[i]] == kHighsInf)
        updateRedundantRows(mip->a_matrix_.index_[i], HighsInt{1},
                            activitymininf_[mip->a_matrix_.index_[i]],
                            activitymin_[mip->a_matrix_.index_[i]],
                            mip->row_lower_[mip->a_matrix_.index_[i]]);

      if (deltamin <= 0) {
        updateThresholdUbChange(col, newbound, mip->a_matrix_.value_[i],
                                capacityThreshold_[mip->a_matrix_.index_[i]]);
        continue;
      }

      if (mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf &&
          activitymininf_[mip->a_matrix_.index_[i]] == 0 &&
          activitymin_[mip->a_matrix_.index_[i]] -
                  mip->row_upper_[mip->a_matrix_.index_[i]] >
              mipsolver->mipdata_->feastol) {
        mipsolver->mipdata_->debugSolution.nodePruned(*this);
        infeasible_ = true;
        infeasible_pos = domchgstack_.size();
        infeasible_reason = Reason::modelRowUpper(mip->a_matrix_.index_[i]);
        end = i + 1;
        break;
      }

      if (activitymininf_[mip->a_matrix_.index_[i]] <= 1 &&
          !propagateflags_[mip->a_matrix_.index_[i]] &&
          mip->row_upper_[mip->a_matrix_.index_[i]] != kHighsInf) {
        markPropagate(mip->a_matrix_.index_[i]);
        // propagateflags_[mip->a_matrix_.index_[i]] = 1;
        // propagateinds_.push_back(mip->a_matrix_.index_[i]);
      }
    }
  }

  if (!infeasible_) {
    for (CutpoolPropagation& cutpoolprop : cutpoolpropagation)
      cutpoolprop.updateActivityUbChange(col, oldbound, newbound);
  } else {
    assert(infeasible_reason.type == Reason::kModelRowLower ||
           infeasible_reason.type == Reason::kModelRowUpper);
    assert(infeasible_reason.index == mip->a_matrix_.index_[end - 1]);
  }

  if (infeasible_) {
    std::swap(oldbound, newbound);
    for (HighsInt i = start; i != end; ++i) {
      if (mip->a_matrix_.value_[i] > 0) {
        activitymax_[mip->a_matrix_.index_[i]] +=
            computeDelta(mip->a_matrix_.value_[i], oldbound, newbound,
                         kHighsInf, activitymaxinf_[mip->a_matrix_.index_[i]]);
      } else {
        activitymin_[mip->a_matrix_.index_[i]] +=
            computeDelta(mip->a_matrix_.value_[i], oldbound, newbound,
                         kHighsInf, activitymininf_[mip->a_matrix_.index_[i]]);
      }
    }

    if (objProp_.isActive()) {
      objProp_.updateActivityUbChange(col, oldbound, newbound);
    }

    return;
  } else {
    for (ConflictPoolPropagation& conflictprop : conflictPoolPropagation)
      conflictprop.updateActivityUbChange(col, oldbound, newbound);
  }
}